

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

opj_bool dwt_decode_real(opj_tcd_tilecomp_t *tilec,int numres)

{
  opj_tcd_resolution_t *poVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  OPJ_UINT32 OVar6;
  v4 *__ptr;
  float *pfVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  float *pfVar11;
  long lVar12;
  float *pfVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  opj_tcd_resolution_t *r;
  float *pfVar19;
  long lVar20;
  float *pfVar21;
  ulong uVar22;
  int x;
  uint uVar23;
  float *pfVar24;
  float *local_e8;
  int local_dc;
  v4dwt_t h;
  v4dwt_t v;
  
  r = tilec->resolutions;
  iVar18 = r->x1;
  iVar2 = r->y1;
  iVar3 = r->x0;
  iVar4 = r->y0;
  lVar20 = (long)tilec->x1;
  lVar12 = (long)tilec->x0;
  x = tilec->x1 - tilec->x0;
  OVar6 = dwt_max_resolution(r,numres);
  __ptr = (v4 *)malloc((ulong)(OVar6 + 5) << 4);
  iVar10 = x * 4;
  uVar23 = iVar18 - iVar3;
  uVar8 = iVar2 - iVar4;
  local_dc = numres;
  h.wavelet = __ptr;
  v.wavelet = __ptr;
  while (local_dc = local_dc + -1, local_dc != 0) {
    local_e8 = (float *)tilec->data;
    iVar18 = (tilec->y1 - tilec->y0) * x;
    poVar1 = r + 1;
    uVar15 = r[1].x1 - r[1].x0;
    h.dn = uVar15 - uVar23;
    h.cas = r[1].x0 % 2;
    lVar14 = (long)(int)uVar15;
    pfVar19 = local_e8 + lVar14 + ((lVar20 + -1) - lVar12);
    pfVar21 = local_e8 + lVar14 + (long)(x * 2) + -1;
    pfVar24 = local_e8 + lVar14 + (long)(x * 3) + -1;
    pfVar13 = local_e8 + lVar14 + -1;
    uVar16 = r[1].y1 - r[1].y0;
    pfVar11 = local_e8;
    h.sn = uVar23;
    v.sn = uVar8;
    for (uVar17 = uVar16; 3 < (int)uVar17; uVar17 = uVar17 - 4) {
      v4dwt_interleave_h(&h,pfVar11,x,iVar18);
      v4dwt_decode(&h);
      pfVar7 = (float *)((long)__ptr + lVar14 * 0x10 + -4);
      for (lVar9 = 0; 0 < lVar9 + lVar14; lVar9 = lVar9 + -1) {
        pfVar13[lVar9] = pfVar7[-3];
        pfVar19[lVar9] = pfVar7[-2];
        pfVar21[lVar9] = pfVar7[-1];
        pfVar24[lVar9] = *pfVar7;
        pfVar7 = pfVar7 + -4;
      }
      pfVar11 = pfVar11 + iVar10;
      iVar18 = iVar18 + x * -4;
      pfVar19 = pfVar19 + iVar10;
      pfVar21 = pfVar21 + iVar10;
      pfVar24 = pfVar24 + iVar10;
      pfVar13 = pfVar13 + iVar10;
    }
    uVar23 = uVar16 & 3;
    if (uVar23 != 0) {
      v4dwt_interleave_h(&h,pfVar11,x,iVar18);
      v4dwt_decode(&h);
      pfVar11 = (float *)((long)__ptr + lVar14 * 0x10 + -8);
      for (lVar9 = 0; 0 < lVar9 + lVar14; lVar9 = lVar9 + -1) {
        if (uVar23 != 1) {
          if (uVar23 != 2) {
            pfVar21[lVar9] = *pfVar11;
          }
          pfVar19[lVar9] = pfVar11[-1];
        }
        pfVar13[lVar9] = pfVar11[-2];
        pfVar11 = pfVar11 + -4;
      }
    }
    v.dn = uVar16 - uVar8;
    v.cas = r[1].y0 % 2;
    uVar22 = 0;
    if (0 < (int)uVar16) {
      uVar22 = (ulong)uVar16;
    }
    for (uVar23 = uVar15; 3 < (int)uVar23; uVar23 = uVar23 - 4) {
      v4dwt_interleave_v(&v,local_e8,x,4);
      v4dwt_decode(&v);
      pfVar19 = local_e8;
      for (lVar14 = 0; uVar22 * 0x10 != lVar14; lVar14 = lVar14 + 0x10) {
        uVar5 = ((undefined8 *)((long)__ptr + lVar14))[1];
        *(undefined8 *)pfVar19 = *(undefined8 *)((long)__ptr + lVar14);
        *(undefined8 *)(pfVar19 + 2) = uVar5;
        pfVar19 = pfVar19 + (lVar20 - lVar12);
      }
      local_e8 = local_e8 + 4;
    }
    uVar17 = uVar15 & 3;
    r = poVar1;
    uVar23 = uVar15;
    uVar8 = uVar16;
    if (uVar17 != 0) {
      v4dwt_interleave_v(&v,local_e8,x,uVar17);
      v4dwt_decode(&v);
      for (lVar14 = 0; uVar22 * 0x10 != lVar14; lVar14 = lVar14 + 0x10) {
        memcpy(local_e8,(void *)((long)__ptr + lVar14),(ulong)(uVar17 << 2));
        local_e8 = local_e8 + (lVar20 - lVar12);
      }
    }
  }
  free(__ptr);
  return 1;
}

Assistant:

opj_bool dwt_decode_real(opj_tcd_tilecomp_t* restrict tilec, int numres){
	v4dwt_t h;
	v4dwt_t v;

	opj_tcd_resolution_t* res = tilec->resolutions;

	int rw = res->x1 - res->x0;	/* width of the resolution level computed */
	int rh = res->y1 - res->y0;	/* height of the resolution level computed */

	int w = tilec->x1 - tilec->x0;

	h.wavelet = (v4*) opj_aligned_malloc((dwt_max_resolution(res, numres)+5) * sizeof(v4));
	v.wavelet = h.wavelet;

	while( --numres) {
		float * restrict aj = (float*) tilec->data;
		int bufsize = (tilec->x1 - tilec->x0) * (tilec->y1 - tilec->y0);
		int j;

		h.sn = rw;
		v.sn = rh;

		++res;

		rw = res->x1 - res->x0;	/* width of the resolution level computed */
		rh = res->y1 - res->y0;	/* height of the resolution level computed */

		h.dn = rw - h.sn;
		h.cas = res->x0 % 2;

		for(j = rh; j > 3; j -= 4){
			int k;
			v4dwt_interleave_h(&h, aj, w, bufsize);
			v4dwt_decode(&h);
				for(k = rw; --k >= 0;){
					aj[k    ] = h.wavelet[k].f[0];
					aj[k+w  ] = h.wavelet[k].f[1];
					aj[k+w*2] = h.wavelet[k].f[2];
					aj[k+w*3] = h.wavelet[k].f[3];
				}
			aj += w*4;
			bufsize -= w*4;
		}
		if (rh & 0x03) {
				int k;
			j = rh & 0x03;
			v4dwt_interleave_h(&h, aj, w, bufsize);
			v4dwt_decode(&h);
				for(k = rw; --k >= 0;){
					switch(j) {
						case 3: aj[k+w*2] = h.wavelet[k].f[2];
						case 2: aj[k+w  ] = h.wavelet[k].f[1];
						case 1: aj[k    ] = h.wavelet[k].f[0];
					}
				}
			}

		v.dn = rh - v.sn;
		v.cas = res->y0 % 2;

		aj = (float*) tilec->data;
		for(j = rw; j > 3; j -= 4){
			int k;
			v4dwt_interleave_v(&v, aj, w, 4);
			v4dwt_decode(&v);
				for(k = 0; k < rh; ++k){
					memcpy(&aj[k*w], &v.wavelet[k], 4 * sizeof(float));
				}
			aj += 4;
		}
		if (rw & 0x03){
				int k;
			j = rw & 0x03;
			v4dwt_interleave_v(&v, aj, w, j);
			v4dwt_decode(&v);
				for(k = 0; k < rh; ++k){
					memcpy(&aj[k*w], &v.wavelet[k], j * sizeof(float));
				}
			}
	}

	opj_aligned_free(h.wavelet);
	return OPJ_TRUE;
}